

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall BpTree<float>::InsertNode(BpTree<float> *this,IndexNode<float> *Node)

{
  pointer piVar1;
  pointer pcVar2;
  int iVar3;
  string local_a0;
  IndexNode<float> local_80;
  
  piVar1 = (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar1) {
    iVar3 = this->Current_Off + 1;
    this->Current_Off = iVar3;
    (Node->self).FileOff = iVar3;
  }
  else {
    (Node->self).FileOff = piVar1[-1];
    (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1 + -1;
  }
  pcVar2 = (this->Index_FileName)._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + (this->Index_FileName)._M_string_length);
  iVar3 = Buffer::Allocate(&blocks,&local_a0,(Node->self).FileOff);
  (Node->self).BlockNum = iVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_80.NodeState = Node->NodeState;
  std::vector<float,_std::allocator<float>_>::vector(&local_80.k,&Node->k);
  std::vector<char,_std::allocator<char>_>::vector(&local_80.v,&Node->v);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_80.p,&Node->p);
  local_80.parent = Node->parent;
  local_80.self = Node->self;
  Node2Block(this,&local_80);
  if (local_80.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BpTree<K>::InsertNode(IndexNode<K>& Node) {
	Addr p;
	if (this->FileOff_bin.empty()) {
		Node.self.FileOff = ++this->Current_Off;
	}
	else{
		Node.self.FileOff = this->FileOff_bin.back();
		this->FileOff_bin.pop_back();
	}
	Node.self.BlockNum = blocks.Allocate(this->Index_FileName, Node.self.FileOff);	//Ϊ�ý������buffer�е�һ���ڴ棬��Ŵ���Block_Num��,������
	this->Node2Block(Node);															//�������Ϣ����鵱��
}